

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

void QTestResult::addFailure(char *message,char *file,int line)

{
  QCoreApplication *pQVar1;
  QTestEventLoop *this;
  QTestEventLoop *pQVar2;
  undefined4 in_EDX;
  char *in_stack_00000028;
  undefined1 failed;
  
  failed = (undefined1)((uint)in_EDX >> 0x10);
  clearExpectFail();
  pQVar1 = QCoreApplication::instance();
  if (pQVar1 != (QCoreApplication *)0x0) {
    this = (QTestEventLoop *)QThread::currentThread();
    QCoreApplication::instance();
    pQVar2 = (QTestEventLoop *)QObject::thread();
    if (this == pQVar2) {
      QTestEventLoop::instance();
      QTestEventLoop::exitLoop(this);
    }
  }
  if ((QTest::blacklistCurrentTest & 1) == 0) {
    QTestLog::addFail(in_stack_00000028,message,file._4_4_);
  }
  else {
    QTestLog::addBFail(in_stack_00000028,message,file._4_4_);
  }
  QTest::setFailed((bool)failed);
  return;
}

Assistant:

void QTestResult::addFailure(const char *message, const char *file, int line)
{
    clearExpectFail();
    if (qApp && QThread::currentThread() == qApp->thread())
        QTestEventLoop::instance().exitLoop();

    if (QTest::blacklistCurrentTest)
        QTestLog::addBFail(message, file, line);
    else
        QTestLog::addFail(message, file, line);
    QTest::setFailed(true);
}